

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall sglr::GLContext::deleteTextures(GLContext *this,int numTextures,deUint32 *textures)

{
  int local_24;
  int i;
  deUint32 *textures_local;
  int numTextures_local;
  GLContext *this_local;
  
  for (local_24 = 0; local_24 < numTextures; local_24 = local_24 + 1) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
              (&this->m_allocatedTextures,textures + local_24);
  }
  glu::CallLogWrapper::glDeleteTextures(this->m_wrapper,numTextures,textures);
  return;
}

Assistant:

void GLContext::deleteTextures (int numTextures, const deUint32* textures)
{
	for (int i = 0; i < numTextures; i++)
		m_allocatedTextures.erase(textures[i]);
	m_wrapper->glDeleteTextures(numTextures, textures);
}